

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpi_comm_and_stream_wrapper.hpp
# Opt level: O1

void __thiscall
Al::internal::MPICommAndStreamWrapper<int>::MPICommAndStreamWrapper
          (MPICommAndStreamWrapper<int> *this,MPI_Comm comm_,int stream_)

{
  undefined1 auVar1 [16];
  string local_60;
  string local_40;
  
  this->stream = stream_;
  this->comm = (MPI_Comm)&ompi_mpi_comm_null;
  this->local_comm = (MPI_Comm)&ompi_mpi_comm_null;
  if (comm_ != (MPI_Comm)&ompi_mpi_comm_null) {
    MPI_Comm_dup(comm_,&this->comm);
    MPI_Comm_rank(this->comm,&this->rank_in_comm);
    MPI_Comm_size(this->comm,&this->size_of_comm);
    MPI_Comm_split_type(this->comm,0,0,&ompi_mpi_info_null,&this->local_comm);
    MPI_Comm_rank(this->local_comm,&this->rank_in_local_comm);
    MPI_Comm_size(this->local_comm,&this->size_of_local_comm);
    return;
  }
  auVar1 = __cxa_allocate_exception(0x70);
  build_string<char_const(&)[48]>
            (&local_40,(Al *)"Cannot create a communicator with MPI_COMM_NULL",auVar1._8_8_);
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_60,
             "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]Aluminum/include/aluminum/mpi_comm_and_stream_wrapper.hpp"
             ,"");
  al_exception::al_exception(auVar1._0_8_,&local_40,&local_60,0x36);
  __cxa_throw(auVar1._0_8_,&al_exception::typeinfo,al_exception::~al_exception);
}

Assistant:

MPICommAndStreamWrapper(MPI_Comm comm_, Stream stream_) :
    stream(stream_)
  {
    if (comm_ == MPI_COMM_NULL) {
      throw_al_exception("Cannot create a communicator with MPI_COMM_NULL");
    }

    // Duplicate the communicator to avoid interference.
    MPI_Comm_dup(comm_, &comm);
    MPI_Comm_rank(comm, &rank_in_comm);
    MPI_Comm_size(comm, &size_of_comm);
    MPI_Comm_split_type(comm, MPI_COMM_TYPE_SHARED, 0, MPI_INFO_NULL,
                        &local_comm);
    MPI_Comm_rank(local_comm, &rank_in_local_comm);
    MPI_Comm_size(local_comm, &size_of_local_comm);
  }